

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O1

void __thiscall
ParticleArrayTest_Size_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>_>::TestBody
          (ParticleArrayTest_Size_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>_>
           *this)

{
  PositionType minPosition;
  PositionType maxPosition;
  bool bVar1;
  long lVar2;
  int i;
  int iVar3;
  Particle *pPVar4;
  iterator iVar5;
  char *message;
  byte bVar6;
  int numParticles;
  PositionType position;
  ParticleArray particles;
  PositionType position_1;
  AssertionResult gtest_ar;
  int local_dc;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  void *local_b8;
  iterator iStack_b0;
  Particle<(pica::Dimension)3> *local_a8;
  AssertHelper local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  Particle local_78;
  
  bVar6 = 0;
  local_b8 = (void *)0x0;
  iStack_b0._M_current = (Particle<(pica::Dimension)3> *)0x0;
  local_a8 = (Particle<(pica::Dimension)3> *)0x0;
  local_dc = 0xc;
  iVar3 = 0;
  do {
    local_d8.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0xc024000000000000;
    uStack_d0 = 0xc024000000000000;
    local_c8 = 0xc024000000000000;
    local_98.data_ = (AssertHelperData *)0x4024000000000000;
    uStack_90 = 0x4024000000000000;
    local_88 = 0x4024000000000000;
    minPosition.y = -10.0;
    minPosition.x = -10.0;
    minPosition.z = -10.0;
    maxPosition.y = 10.0;
    maxPosition.x = 10.0;
    maxPosition.z = 10.0;
    BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
              (&local_78,(BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *)this,
               minPosition,maxPosition);
    if (iStack_b0._M_current == local_a8) {
      std::
      vector<pica::Particle<(pica::Dimension)3>,std::allocator<pica::Particle<(pica::Dimension)3>>>
      ::_M_realloc_insert<pica::Particle<(pica::Dimension)3>const&>
                ((vector<pica::Particle<(pica::Dimension)3>,std::allocator<pica::Particle<(pica::Dimension)3>>>
                  *)&local_b8,iStack_b0,&local_78);
    }
    else {
      pPVar4 = &local_78;
      iVar5._M_current = iStack_b0._M_current;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        ((iVar5._M_current)->position).x = (pPVar4->position).x;
        pPVar4 = (Particle *)((long)pPVar4 + (ulong)bVar6 * -0x10 + 8);
        iVar5._M_current = iVar5._M_current + (ulong)bVar6 * -0x10 + 8;
      }
      iStack_b0._M_current = iStack_b0._M_current + 1;
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 < local_dc);
  local_d8.ptr_._0_4_ =
       (int)((ulong)((long)iStack_b0._M_current - (long)local_b8) >> 3) * 0x38e38e39;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_78,"numParticles","particles.size()",&local_dc,(int *)&local_d8);
  if (local_78.position.x._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_d8);
    if ((undefined8 *)local_78.position.y == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_78.position.y;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x45,message);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_d8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_d8.ptr_ + 8))();
      }
      local_d8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78.position.y,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_b8 != (void *)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Size)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    int numParticles = 12;
    for (int i = 0; i < numParticles; i++)
        particles.pushBack(this->randomParticle());
    ASSERT_EQ(numParticles, particles.size());
}